

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O0

void bufchain_consume(bufchain *ch,size_t len)

{
  bufchain_granule *b;
  int local_24;
  int remlen;
  bufchain_granule *tmp;
  size_t len_local;
  bufchain *ch_local;
  
  tmp = (bufchain_granule *)len;
  if (ch->buffersize < len) {
    __assert_fail("ch->buffersize >= len",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/bufchain.c"
                  ,0x68,"void bufchain_consume(bufchain *, size_t)");
  }
  while( true ) {
    if (tmp == (bufchain_granule *)0x0) {
      return;
    }
    local_24 = (int)tmp;
    if (ch->head == (bufchain_granule *)0x0) break;
    if ((long)local_24 < (long)ch->head->bufend - (long)ch->head->bufpos) {
      ch->head->bufpos = ch->head->bufpos + local_24;
    }
    else {
      local_24 = (int)ch->head->bufend - (int)ch->head->bufpos;
      b = ch->head;
      ch->head = b->next;
      if (ch->head == (bufchain_granule *)0x0) {
        ch->tail = (bufchain_granule *)0x0;
      }
      smemclr(b,0x20);
      safefree(b);
    }
    ch->buffersize = ch->buffersize - (long)local_24;
    tmp = (bufchain_granule *)((long)tmp - (long)local_24);
  }
  __assert_fail("ch->head != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/bufchain.c"
                ,0x6b,"void bufchain_consume(bufchain *, size_t)");
}

Assistant:

void bufchain_consume(bufchain *ch, size_t len)
{
    struct bufchain_granule *tmp;

    assert(ch->buffersize >= len);
    while (len > 0) {
        int remlen = len;
        assert(ch->head != NULL);
        if (remlen >= ch->head->bufend - ch->head->bufpos) {
            remlen = ch->head->bufend - ch->head->bufpos;
            tmp = ch->head;
            ch->head = tmp->next;
            if (!ch->head)
                ch->tail = NULL;
            smemclr(tmp, sizeof(*tmp));
            sfree(tmp);
        } else
            ch->head->bufpos += remlen;
        ch->buffersize -= remlen;
        len -= remlen;
    }
}